

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::LangevinPiston>::~IntegratorBuilder
          (IntegratorBuilder<OpenMD::LangevinPiston> *this)

{
  void *in_RDI;
  
  ~IntegratorBuilder((IntegratorBuilder<OpenMD::LangevinPiston> *)0x1f8198);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

IntegratorBuilder(const std::string& ident) : IntegratorCreator(ident) {}